

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int getNodeSize(sqlite3 *db,Rtree *pRtree,int isCreate,char **pzErr)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  sqlite3_vfs *psVar5;
  sqlite3 *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_FS_OFFSET;
  char *zSql;
  int rc;
  int iPageSize;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = 0xaaaaaaaa;
  if (in_EDX == 0) {
    piVar3 = (int *)sqlite3_mprintf("SELECT length(data) FROM \'%q\'.\'%q_node\' WHERE nodeno = 1",
                                    *(undefined8 *)(in_RSI + 0x30),*(undefined8 *)(in_RSI + 0x38));
    iVar2 = getIntFromStmt(in_RCX,(char *)CONCAT44(uVar6,in_stack_ffffffffffffffc8),piVar3);
    if (iVar2 == 0) {
      if (*(int *)(in_RSI + 0x20) < 0x1c0) {
        iVar2 = 0x10b;
        psVar5 = (sqlite3_vfs *)
                 sqlite3_mprintf("undersize RTree blobs in \"%q_node\"",
                                 *(undefined8 *)(in_RSI + 0x38));
        in_RCX->pVfs = psVar5;
      }
    }
    else {
      pcVar4 = sqlite3_errmsg((sqlite3 *)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
      psVar5 = (sqlite3_vfs *)sqlite3_mprintf("%s",pcVar4);
      in_RCX->pVfs = psVar5;
    }
  }
  else {
    piVar3 = (int *)sqlite3_mprintf("PRAGMA %Q.page_size",*(undefined8 *)(in_RSI + 0x30));
    iVar2 = getIntFromStmt(in_RCX,(char *)CONCAT44(uVar6,in_stack_ffffffffffffffc8),piVar3);
    if (iVar2 == 0) {
      *(undefined4 *)(in_RSI + 0x20) = 0xffffffc0;
      if ((int)((uint)*(byte *)(in_RSI + 0x27) * 0x33 + 4) < *(int *)(in_RSI + 0x20)) {
        *(uint *)(in_RSI + 0x20) = (uint)*(byte *)(in_RSI + 0x27) * 0x33 + 4;
      }
    }
    else {
      pcVar4 = sqlite3_errmsg((sqlite3 *)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
      psVar5 = (sqlite3_vfs *)sqlite3_mprintf("%s",pcVar4);
      in_RCX->pVfs = psVar5;
    }
  }
  sqlite3_free((void *)0x29950c);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int getNodeSize(
  sqlite3 *db,                    /* Database handle */
  Rtree *pRtree,                  /* Rtree handle */
  int isCreate,                   /* True for xCreate, false for xConnect */
  char **pzErr                    /* OUT: Error message, if any */
){
  int rc;
  char *zSql;
  if( isCreate ){
    int iPageSize = 0;
    zSql = sqlite3_mprintf("PRAGMA %Q.page_size", pRtree->zDb);
    rc = getIntFromStmt(db, zSql, &iPageSize);
    if( rc==SQLITE_OK ){
      pRtree->iNodeSize = iPageSize-64;
      if( (4+pRtree->nBytesPerCell*RTREE_MAXCELLS)<pRtree->iNodeSize ){
        pRtree->iNodeSize = 4+pRtree->nBytesPerCell*RTREE_MAXCELLS;
      }
    }else{
      *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
    }
  }else{
    zSql = sqlite3_mprintf(
        "SELECT length(data) FROM '%q'.'%q_node' WHERE nodeno = 1",
        pRtree->zDb, pRtree->zName
    );
    rc = getIntFromStmt(db, zSql, &pRtree->iNodeSize);
    if( rc!=SQLITE_OK ){
      *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
    }else if( pRtree->iNodeSize<(512-64) ){
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
      *pzErr = sqlite3_mprintf("undersize RTree blobs in \"%q_node\"",
                               pRtree->zName);
    }
  }

  sqlite3_free(zSql);
  return rc;
}